

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O3

void __thiscall helics::CommonCore::processPriorityCommand(CommonCore *this,ActionMessage *command)

{
  BrokerBase *this_00;
  ushort uVar1;
  action_t aVar2;
  pointer pcVar3;
  size_type sVar4;
  size_t sVar5;
  size_t sVar6;
  TimeoutMonitor *this_01;
  size_t sVar7;
  byte *pbVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  FedInfo *pFVar10;
  string_view message;
  string_view message_00;
  string_view message_01;
  string_view message_02;
  string_view message_03;
  bool bVar11;
  __type _Var12;
  int iVar13;
  _func_int **pp_Var14;
  FederateState *pFVar15;
  string *this_02;
  int iVar16;
  ActionMessage *in_RDX;
  ActionMessage *command_00;
  GlobalFederateId GVar17;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 in_R9;
  size_type __rlen;
  string_view federateName;
  string_view federateName_00;
  string_view federateName_01;
  string_view estring;
  string_view fmt;
  string_view existingValue;
  string_view searchValue;
  string_view fmt_00;
  string_view estring_00;
  optional<unsigned_long> oVar18;
  format_args args;
  format_args args_00;
  string_view name;
  string_view name_00;
  string_view name_01;
  string_view name_02;
  string_view name_03;
  ActionMessage resend;
  int in_stack_fffffffffffffe6c;
  string local_188;
  ActionMessage *local_168;
  string local_160;
  CommonCore *local_140;
  size_t local_138;
  char *pcStack_130;
  FedInfo *local_128;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paStack_120;
  undefined8 local_118;
  char *pcStack_110;
  undefined8 local_108;
  char *pcStack_100;
  size_t local_f8;
  char *pcStack_f0;
  undefined1 local_e8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d8 [10];
  
  this_00 = &this->super_BrokerBase;
  if (0x17 < (this->super_BrokerBase).maxLogLevel.super___atomic_base<int>._M_i) {
    GVar17.gid = (this->super_BrokerBase).global_broker_id_local.gid;
    pcVar3 = (this->super_BrokerBase).identifier._M_dataplus._M_p;
    sVar4 = (this->super_BrokerBase).identifier._M_string_length;
    local_140 = this;
    prettyPrintString_abi_cxx11_(&local_160,(helics *)command,in_RDX);
    local_e8._0_8_ = local_160._M_dataplus._M_p;
    local_e8._8_8_ = local_160._M_string_length;
    local_d8[0]._0_4_ = (command->source_id).gid;
    fmt.size_ = 0x1d;
    fmt.data_ = (char *)0x1a;
    args.field_1.values_ = in_R9.values_;
    args.desc_ = (unsigned_long_long)local_e8;
    local_168 = command;
    ::fmt::v11::vformat_abi_cxx11_(&local_188,(v11 *)"|| priority_cmd:{} from {}",fmt,args);
    local_f8 = local_188._M_string_length;
    pcStack_f0 = local_188._M_dataplus._M_p;
    in_stack_fffffffffffffe6c = (int)(local_188._M_string_length >> 0x20);
    in_R9.values_ = (value<fmt::v11::context> *)0x0;
    message._M_str = local_188._M_dataplus._M_p;
    message._M_len = local_188._M_string_length;
    name._M_str = pcVar3;
    name._M_len = sVar4;
    BrokerBase::sendToLogger(this_00,GVar17,0x18,name,message,false);
    this = local_140;
    command = local_168;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_188._M_dataplus._M_p != &local_188.field_2) {
      operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_160._M_dataplus._M_p != &local_160.field_2) {
      operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
    }
  }
  aVar2 = command->messageAction;
  if (~(cmd_time_check|cmd_tick) < aVar2) {
    if (aVar2 < cmd_route_ack) {
      if (aVar2 == cmd_broker_query) goto LAB_002f9827;
      if (aVar2 == cmd_broker_ack) {
        sVar5 = (command->payload).bufferSize;
        if (sVar5 != (this->super_BrokerBase).identifier._M_string_length) {
          return;
        }
        if ((sVar5 != 0) &&
           (iVar13 = bcmp((command->payload).heap,
                          (this->super_BrokerBase).identifier._M_dataplus._M_p,sVar5), iVar13 != 0))
        {
          return;
        }
        if ((command->flags & 0x10) != 0) {
          local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_188,"broker responded with error: ","");
          errorMessageString_abi_cxx11_(&local_160,(helics *)command,command_00);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_e8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&local_188,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_160);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_160._M_dataplus._M_p != &local_160.field_2) {
            operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_188._M_dataplus._M_p != &local_188.field_2) {
            operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
          }
          estring_00._M_str = (char *)local_e8._0_8_;
          estring_00._M_len = local_e8._8_8_;
          BrokerBase::setErrorState(this_00,command->messageID,estring_00);
          estring._M_str = (char *)local_e8._0_8_;
          estring._M_len = local_e8._8_8_;
          errorRespondDelayedMessages(this,estring);
          local_128 = (FedInfo *)local_e8._8_8_;
          paStack_120 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_e8._0_8_;
          message_03._M_str = (char *)local_e8._0_8_;
          message_03._M_len = local_e8._8_8_;
          name_03._M_str = (this->super_BrokerBase).identifier._M_dataplus._M_p;
          name_03._M_len = (this->super_BrokerBase).identifier._M_string_length;
          BrokerBase::sendToLogger(this_00,(GlobalFederateId)0x0,0,name_03,message_03,false);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e8._0_8_ == local_d8) {
            return;
          }
          operator_delete((void *)local_e8._0_8_,(ulong)(local_d8[0]._M_allocated_capacity + 1));
          return;
        }
        iVar13 = (command->dest_id).gid;
        LOCK();
        (this->super_BrokerBase).global_id._M_i.gid = iVar13;
        UNLOCK();
        iVar16 = 0x6fffffff;
        if (iVar13 != 1) {
          iVar16 = iVar13 * -3 + -0x40000006;
        }
        (this->super_BrokerBase).global_broker_id_local.gid = iVar13;
        LOCK();
        (this->filterFedID)._M_i.gid = iVar16;
        UNLOCK();
        iVar16 = 0x6ffffffe;
        if (iVar13 != 1) {
          iVar16 = iVar13 * -3 + -0x40000005;
        }
        LOCK();
        (this->translatorFedID)._M_i.gid = iVar16;
        UNLOCK();
        (((this->super_BrokerBase).timeCoord._M_t.
          super___uniq_ptr_impl<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
          ._M_t.
          super__Tuple_impl<0UL,_helics::BaseTimeCoordinator_*,_std::default_delete<helics::BaseTimeCoordinator>_>
          .super__Head_base<0UL,_helics::BaseTimeCoordinator_*,_false>._M_head_impl)->mSourceId).gid
             = iVar13;
        (this->super_BrokerBase).higher_broker_id.gid = (command->source_id).gid;
        transmitDelayedMessages(this);
        this_01 = (this->timeoutMon)._M_t.
                  super___uniq_ptr_impl<helics::TimeoutMonitor,_std::default_delete<helics::TimeoutMonitor>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_helics::TimeoutMonitor_*,_std::default_delete<helics::TimeoutMonitor>_>
                  .super__Head_base<0UL,_helics::TimeoutMonitor_*,_false>._M_head_impl;
        (this_01->parentConnection).connection.gid = (this->super_BrokerBase).higher_broker_id.gid;
        uVar1 = command->flags;
        if ((uVar1 >> 0xe & 1) != 0) {
          (this_01->parentConnection).disablePing = true;
          (this_01->parentConnection).waitingForPingReply = false;
        }
        if (((uVar1 & 0x20) != 0) &&
           ((this->super_BrokerBase).globalTime = true, (char)uVar1 < '\0')) {
          (this->super_BrokerBase).asyncTime = true;
        }
        if ((uVar1 >> 0xb & 1) != 0) {
          (this->super_BrokerBase).globalDisconnect = true;
        }
        TimeoutMonitor::reset(this_01);
        if (-1 < (this->delayInitCounter).super___atomic_base<short>._M_i) {
          return;
        }
        if ((this->super_BrokerBase).minFederateCount != 0) {
          return;
        }
        if ((this->super_BrokerBase).minChildCount != 0) {
          return;
        }
        bVar11 = allInitReady(this);
        if (!bVar11) {
          return;
        }
        bVar11 = BrokerBase::transitionBrokerState(this_00,CONNECTED,INITIALIZING);
        if (!bVar11) {
          return;
        }
        ActionMessage::ActionMessage((ActionMessage *)local_e8,cmd_init);
        if (((this->initIterations)._M_base._M_i & 1U) != 0) {
          local_d8[0]._10_1_ = local_d8[0]._M_local_buf[10] | 1;
        }
        checkDependencies(this);
        local_e8._8_4_ = (this->super_BrokerBase).global_broker_id_local.gid;
        local_d8[0]._M_allocated_capacity = local_d8[0]._M_allocated_capacity & 0xffffffff00000000;
        (*(this->super_Core)._vptr_Core[0x6b])(this,0);
        goto LAB_002f9ad0;
      }
      if (aVar2 == cmd_fed_ack) {
        federateName._M_str = (char *)(command->payload).heap;
        federateName._M_len = (command->payload).bufferSize;
        pFVar15 = getFederateCore(this,federateName);
        if (pFVar15 == (FederateState *)0x0) {
          return;
        }
        if ((command->flags & 0x10) == 0) {
          LOCK();
          (pFVar15->global_id)._M_i.gid = (command->dest_id).gid;
          UNLOCK();
          existingValue._M_str = (char *)(command->payload).heap;
          existingValue._M_len = (command->payload).bufferSize;
          gmlc::containers::
          DualStringMappedVector<helics::FedInfo,_helics::GlobalFederateId,_(reference_stability)0,_5>
          ::addSearchTerm(&this->loopFederates,&command->dest_id,existingValue);
          iVar13 = (this->keyFed).gid;
          if ((iVar13 == -1700000000) || (iVar13 == -2010000000)) {
            (this->keyFed).gid = (pFVar15->global_id)._M_i.gid;
          }
        }
        else {
          local_168 = (ActionMessage *)(this->super_BrokerBase).identifier._M_dataplus._M_p;
          sVar4 = (this->super_BrokerBase).identifier._M_string_length;
          paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)(command->payload).heap;
          pFVar10 = (FedInfo *)(command->payload).bufferSize;
          local_d8[0]._0_8_ = commandErrorString(in_stack_fffffffffffffe6c);
          fmt_00.size_ = 0xcd;
          fmt_00.data_ = (char *)0x37;
          args_00.field_1.args_ = in_R9.args_;
          args_00.desc_ = (unsigned_long_long)local_e8;
          local_e8._0_8_ = paVar9;
          local_e8._8_8_ = pFVar10;
          ::fmt::v11::vformat_abi_cxx11_
                    (&local_188,(v11 *)"broker responded with error for registration of {}::{}\n",
                     fmt_00,args_00);
          local_138 = local_188._M_string_length;
          pcStack_130 = local_188._M_dataplus._M_p;
          message_01._M_str = local_188._M_dataplus._M_p;
          message_01._M_len = local_188._M_string_length;
          name_01._M_str = (char *)local_168;
          name_01._M_len = sVar4;
          BrokerBase::sendToLogger(this_00,(GlobalFederateId)0x0,0,name_01,message_01,false);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_188._M_dataplus._M_p != &local_188.field_2) {
            operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
          }
        }
        FederateState::addAction(pFVar15,command);
        return;
      }
    }
    else if (aVar2 < cmd_priority_disconnect) {
      if (aVar2 == cmd_route_ack) {
        return;
      }
      if (aVar2 == cmd_register_route) {
        (*(this->super_Core)._vptr_Core[0x6d])
                  (this,(ulong)(uint)(command->dest_handle).hid,0,(command->payload).bufferSize,
                   (command->payload).heap);
        return;
      }
    }
    else {
      if (aVar2 == cmd_priority_disconnect) {
        checkAndProcessDisconnect(this);
        return;
      }
      if (aVar2 == cmd_broker_location) {
        ActionMessage::setAction(command,cmd_protocol);
        command->messageID = 0x14d;
        (*(this->super_Core)._vptr_Core[0x6c])(this,0xffffffff,command);
        ActionMessage::ActionMessage((ActionMessage *)local_e8,cmd_resend);
        local_e8._4_4_ = 0xefffffd8;
        BrokerBase::addActionMessage(this_00,(ActionMessage *)local_e8);
LAB_002f9ad0:
        ActionMessage::~ActionMessage((ActionMessage *)local_e8);
        return;
      }
    }
LAB_002f98f6:
    if (cmd_broker_setup < aVar2) {
      processCommand(this,command);
    }
    return;
  }
  if (aVar2 < cmd_ping_priority) {
    if ((uint)(aVar2 + ~(cmd_reg_broker|cmd_tick)) < 2) {
LAB_002f9827:
      processQueryCommand(this,command);
      return;
    }
    if (aVar2 == cmd_set_global) {
      iVar13 = (this->super_BrokerBase).global_broker_id_local.gid;
      if (iVar13 == 0) goto LAB_002f9bc4;
      (command->source_id).gid = iVar13;
      pp_Var14 = (this->super_Core)._vptr_Core;
      goto LAB_002f9b68;
    }
    if (aVar2 == cmd_reg_broker) {
      sVar5 = (command->payload).bufferSize;
      pcVar3 = (this->super_BrokerBase).identifier._M_dataplus._M_p;
      sVar6 = (this->super_BrokerBase).identifier._M_string_length;
      if ((sVar5 == sVar6) &&
         ((sVar5 == 0 || (iVar13 = bcmp((command->payload).heap,pcVar3,sVar5), iVar13 == 0)))) {
        local_108 = 0x68;
        pcStack_100 = 
        "received locally sent registration message, broker loop, please set the broker address to a valid broker"
        ;
        message_02._M_str =
             "received locally sent registration message, broker loop, please set the broker address to a valid broker"
        ;
        message_02._M_len = 0x68;
        name_02._M_str = pcVar3;
        name_02._M_len = sVar5;
        BrokerBase::sendToLogger
                  (this_00,(GlobalFederateId)(this->super_BrokerBase).global_broker_id_local.gid,0,
                   name_02,message_02,false);
        return;
      }
      local_118 = 0x43;
      pcStack_110 = "Core received reg broker message, likely improper federation setup\n";
      message_00._M_str = "Core received reg broker message, likely improper federation setup\n";
      message_00._M_len = 0x43;
      name_00._M_str = pcVar3;
      name_00._M_len = sVar6;
      BrokerBase::sendToLogger(this_00,(GlobalFederateId)0x0,3,name_00,message_00,false);
      (*(this->super_Core)._vptr_Core[0x6b])(this,0,command);
      return;
    }
    goto LAB_002f98f6;
  }
  if (aVar2 < cmd_reg_fed) {
    if (aVar2 == cmd_ping_priority) {
      if ((command->dest_id).gid != (this->super_BrokerBase).global_broker_id_local.gid) {
        return;
      }
      ActionMessage::ActionMessage((ActionMessage *)local_e8,cmd_ping_reply);
      local_d8[0]._0_4_ = (command->source_id).gid;
      local_e8._8_4_ = (this->super_BrokerBase).global_broker_id_local.gid;
      routeMessage(this,(ActionMessage *)local_e8);
      goto LAB_002f9ad0;
    }
    if (aVar2 == cmd_priority_ack) {
      return;
    }
    goto LAB_002f98f6;
  }
  if (aVar2 == cmd_reg_fed) {
    sVar7 = (command->payload).bufferSize;
    pbVar8 = (command->payload).heap;
    federateName_00._M_str = (char *)pbVar8;
    federateName_00._M_len = sVar7;
    local_e8._0_8_ = getFederate(this,federateName_00);
    oVar18 = gmlc::containers::
             DualStringMappedVector<helics::FedInfo,helics::GlobalFederateId,(reference_stability)0,5>
             ::insert<helics::FederateState*>
                       ((DualStringMappedVector<helics::FedInfo,helics::GlobalFederateId,(reference_stability)0,5>
                         *)&this->loopFederates,sVar7,pbVar8);
    if ((((undefined1  [16])
          oVar18.super__Optional_base<unsigned_long,_true,_true>._M_payload.
          super__Optional_payload_base<unsigned_long> & (undefined1  [16])0x1) ==
         (undefined1  [16])0x0) && ((command->flags & 0x400) != 0)) {
      searchValue._M_str = (char *)(command->payload).heap;
      searchValue._M_len = (command->payload).bufferSize;
      gmlc::containers::
      DualStringMappedVector<helics::FedInfo,_helics::GlobalFederateId,_(reference_stability)0,_5>::
      find((BlockIterator<helics::FedInfo,_32,_helics::FedInfo_**> *)local_e8,&this->loopFederates,
           searchValue);
      *(OperatingState *)(local_e8._8_8_ + 8) = OPERATING;
    }
    iVar13 = (this->super_BrokerBase).global_broker_id_local.gid;
    if (iVar13 == 0) {
LAB_002f9bc4:
      gmlc::containers::SimpleQueue<helics::ActionMessage,_std::mutex>::push<helics::ActionMessage>
                (&this->delayTransmitQueue,command);
      return;
    }
    (command->source_id).gid = iVar13;
    pp_Var14 = (this->super_Core)._vptr_Core;
LAB_002f9b68:
    (*pp_Var14[0x6c])(this,0,command);
    return;
  }
  if (aVar2 != cmd_send_command) goto LAB_002f98f6;
  GVar17.gid = (command->dest_id).gid;
  if (GVar17.gid == (this->super_BrokerBase).global_broker_id_local.gid) {
LAB_002f98bd:
    processCommandInstruction(this,command);
    return;
  }
  if (GVar17.gid == 0) {
    this_02 = ActionMessage::getString_abi_cxx11_(command,0);
    iVar13 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             compare((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_02,
                     "core");
    if ((iVar13 == 0) ||
       (_Var12 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)this_02,&(this->super_BrokerBase).identifier), _Var12))
    goto LAB_002f98bd;
    federateName_01._M_str = (this_02->_M_dataplus)._M_p;
    federateName_01._M_len = this_02->_M_string_length;
    pFVar15 = getFederateCore(this,federateName_01);
    if (pFVar15 != (FederateState *)0x0) goto LAB_002f9d17;
    GVar17.gid = (command->dest_id).gid;
  }
  bVar11 = isLocal(this,GVar17);
  if ((!bVar11) ||
     (pFVar15 = getFederateCore(this,(GlobalFederateId)(command->dest_id).gid),
     pFVar15 == (FederateState *)0x0)) {
    routeMessage(this,command);
    return;
  }
LAB_002f9d17:
  FederateState::sendCommand(pFVar15,command);
  return;
}

Assistant:

void CommonCore::processPriorityCommand(ActionMessage&& command)
{
    // deal with a few types of message immediately
    LOG_TRACE(global_broker_id_local,
              getIdentifier(),
              fmt::format("|| priority_cmd:{} from {}",
                          prettyPrintString(command),
                          command.source_id.baseValue()));
    switch (command.action()) {
        case CMD_PING_PRIORITY:
            if (command.dest_id == global_broker_id_local) {
                ActionMessage pngrep(CMD_PING_REPLY);
                pngrep.dest_id = command.source_id;
                pngrep.source_id = global_broker_id_local;
                routeMessage(pngrep);
            }
            break;
        case CMD_REG_FED: {
            // this one in the core needs to be the thread-safe version of getFederate
            auto insertRes =
                loopFederates.insert(command.name(), no_search, getFederate(command.name()));
            if (!insertRes && checkActionFlag(command, reentrant_flag)) {
                auto lfed = loopFederates.find(command.name());
                lfed->state = OperatingState::OPERATING;
            }

            if (global_broker_id_local != parent_broker_id) {
                // forward on to Broker
                command.source_id = global_broker_id_local;
                transmit(parent_route_id, std::move(command));
            } else {
                // this will get processed when this core is assigned a global hid
                delayTransmitQueue.push(std::move(command));
            }

        } break;
        case CMD_BROKER_LOCATION: {
            command.setAction(CMD_PROTOCOL);
            command.messageID = NEW_BROKER_INFORMATION;
            transmit(control_route, std::move(command));
            ActionMessage resend(CMD_RESEND);
            resend.messageID = static_cast<int32_t>(CMD_REG_BROKER);
            addActionMessage(resend);
        } break;
        case CMD_REG_BROKER:
            // These really shouldn't happen here probably means something went wrong in setup but
            // we can handle it forward the connection request to the higher level
            if (command.name() == identifier) {
                LOG_ERROR(
                    global_broker_id_local,
                    identifier,
                    "received locally sent registration message, broker loop, please set the broker address to "
                    "a valid broker");
            } else {
                LOG_WARNING(parent_broker_id,
                            identifier,
                            "Core received reg broker message, likely improper federation setup\n");
                transmit(parent_route_id, command);
            }
            break;
        case CMD_BROKER_ACK:
            if (command.name() == identifier) {
                if (checkActionFlag(command, error_flag)) {
                    auto estring =
                        std::string("broker responded with error: ") + errorMessageString(command);
                    setErrorState(command.messageID, estring);
                    errorRespondDelayedMessages(estring);
                    LOG_ERROR(parent_broker_id, identifier, estring);
                    break;
                }
                global_id = GlobalBrokerId{command.dest_id};
                global_broker_id_local = GlobalBrokerId{command.dest_id};
                filterFedID = getSpecialFederateId(global_broker_id_local, 0);
                translatorFedID = getSpecialFederateId(global_broker_id_local, 1);
                timeCoord->setSourceId(global_broker_id_local);

                higher_broker_id = GlobalBrokerId{command.source_id};
                transmitDelayedMessages();
                timeoutMon->setParentId(higher_broker_id);
                if (checkActionFlag(command, slow_responding_flag)) {
                    timeoutMon->disableParentPing();
                }
                if (checkActionFlag(command, global_timing_flag)) {
                    globalTime = true;
                    if (checkActionFlag(command, async_timing_flag)) {
                        asyncTime = true;
                    }
                }
                if (checkActionFlag(command, global_disconnect_flag)) {
                    globalDisconnect = true;
                }
                timeoutMon->reset();
                if (delayInitCounter < 0 && minFederateCount == 0 && minChildCount == 0) {
                    if (allInitReady()) {
                        if (transitionBrokerState(BrokerState::CONNECTED,
                                                  BrokerState::INITIALIZING)) {
                            // make sure we only do this once
                            ActionMessage init(CMD_INIT);
                            if (initIterations.load()) {
                                setActionFlag(init, iteration_requested_flag);
                            }
                            checkDependencies();
                            init.source_id = global_broker_id_local;
                            init.dest_id = parent_broker_id;
                            transmit(parent_route_id, init);
                        }
                    }
                }
            }
            break;
        case CMD_FED_ACK: {
            FederateState* fed{nullptr};
            fed = getFederateCore(command.name());
            if (fed != nullptr) {
                if (checkActionFlag(command, error_flag)) {
                    LOG_ERROR(
                        parent_broker_id,
                        identifier,
                        fmt::format("broker responded with error for registration of {}::{}\n",
                                    command.name(),
                                    commandErrorString(command.messageID)));
                } else {
                    fed->global_id = command.dest_id;
                    loopFederates.addSearchTerm(command.dest_id, command.name());
                    if (!keyFed.isValid()) {
                        keyFed = fed->global_id;
                    }
                }

                // push the command to the local queue
                fed->addAction(std::move(command));
            }
        } break;
        case CMD_REG_ROUTE:
            // TODO(PT): double check this
            addRoute(route_id(command.getExtraData()), 0, command.payload.to_string());
            break;
        case CMD_PRIORITY_DISCONNECT:
            checkAndProcessDisconnect();
            break;
        case CMD_SEND_COMMAND:
            if (command.dest_id == global_broker_id_local) {
                processCommandInstruction(command);
                break;
            }
            if (command.dest_id == parent_broker_id) {
                const auto& target = command.getString(targetStringLoc);
                if (target == "core" || target == getIdentifier()) {
                    processCommandInstruction(command);
                    break;
                }
                auto* fed = getFederateCore(target);
                if (fed != nullptr) {
                    fed->sendCommand(command);
                    break;
                }
            }
            if (isLocal(command.dest_id)) {
                auto* fed = getFederateCore(command.dest_id);
                if (fed != nullptr) {
                    fed->sendCommand(command);
                    break;
                }
            }
            routeMessage(std::move(command));
            break;
        case CMD_BROKER_QUERY:
        case CMD_QUERY:
        case CMD_QUERY_REPLY:
            processQueryCommand(command);
            break;
        case CMD_PRIORITY_ACK:
        case CMD_ROUTE_ACK:
            break;
        case CMD_SET_GLOBAL:
            if (global_broker_id_local != parent_broker_id) {
                // forward on to Broker
                command.source_id = global_broker_id_local;
                transmit(parent_route_id, std::move(command));
            } else {
                // this will get processed when this core is assigned a global hid
                delayTransmitQueue.push(std::move(command));
            }
            break;
        default: {
            if (!isPriorityCommand(command)) {
                processCommand(std::move(command));
            }
        }
    }
}